

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O3

BTLeafNode * __thiscall storage::BTLeafNode::split(BTLeafNode *this,int key,Record *record)

{
  long lVar1;
  uint uVar2;
  BTLeafNode *pBVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  ulong uVar13;
  Record *pRVar14;
  uint uVar15;
  Record **ppRVar16;
  
  pBVar3 = (BTLeafNode *)operator_new(0x278);
  (pBVar3->super_BTNode).child_index_ = -1;
  (pBVar3->super_BTNode)._vptr_BTNode = (_func_int **)&PTR_is_leaf_node_00109d90;
  memset(pBVar3->record_links_,0,400);
  pBVar3->next_ = this->next_;
  this->next_ = pBVar3;
  iVar5 = (this->super_BTNode).used_links_count_;
  uVar4 = iVar5 / 2;
  uVar2 = iVar5 - uVar4;
  uVar8 = uVar4;
  if (1 < iVar5) {
    uVar15 = iVar5 - 2;
    bVar12 = false;
    uVar13 = (ulong)uVar2;
    uVar10 = (ulong)(iVar5 - 1);
    uVar7 = uVar4;
    do {
      uVar11 = (ulong)uVar15;
      iVar6 = (this->super_BTNode).keys_[uVar11];
      pRVar14 = this->record_links_[uVar11];
      if (iVar6 < key) {
        if (bVar12) {
          bVar12 = true;
        }
        else {
          bVar12 = true;
          uVar11 = uVar10;
          pRVar14 = record;
          iVar6 = key;
        }
      }
      if ((int)uVar13 < 1) {
        uVar8 = uVar7 - 1;
        (this->super_BTNode).keys_[(long)(int)uVar7 + -1] = iVar6;
        ppRVar16 = this->record_links_ + (long)(int)uVar7 + -1;
      }
      else {
        uVar13 = (ulong)((int)uVar13 - 1);
        (pBVar3->super_BTNode).keys_[uVar13] = iVar6;
        ppRVar16 = pBVar3->record_links_ + uVar13;
        uVar8 = uVar7;
      }
      *ppRVar16 = pRVar14;
      uVar15 = (int)uVar11 - 1;
      uVar10 = uVar11;
      uVar7 = uVar8;
    } while (0 < (int)uVar11);
  }
  if (0 < (int)uVar8) {
    (this->super_BTNode).keys_[uVar8 - 1] = key;
    this->record_links_[uVar8 - 1] = record;
  }
  (pBVar3->super_BTNode).parent_ = (this->super_BTNode).parent_;
  (this->super_BTNode).used_links_count_ = uVar4 + 1;
  (pBVar3->super_BTNode).used_links_count_ = uVar2 + 1;
  if (iVar5 < 4) {
LAB_00105f55:
    if ((int)uVar2 < 2) {
      return pBVar3;
    }
    iVar5 = (pBVar3->super_BTNode).keys_[1];
    if ((pBVar3->super_BTNode).keys_[0] < iVar5) {
      lVar1 = 0;
      do {
        lVar9 = lVar1;
        if ((ulong)uVar2 - 2 == lVar9) break;
        iVar6 = (pBVar3->super_BTNode).keys_[lVar9 + 2];
        bVar12 = iVar5 < iVar6;
        lVar1 = lVar9 + 1;
        iVar5 = iVar6;
      } while (bVar12);
      if ((ulong)uVar2 <= lVar9 + 2U) {
        return pBVar3;
      }
    }
    __assert_fail("cc(M->keys_, M->key_count())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                  ,0x1c8,"BTLeafNode *storage::BTLeafNode::split(int, Record *)");
  }
  iVar5 = (this->super_BTNode).keys_[1];
  if ((this->super_BTNode).keys_[0] < iVar5) {
    lVar1 = 0;
    do {
      lVar9 = lVar1;
      if ((ulong)uVar4 - 2 == lVar9) break;
      iVar6 = (this->super_BTNode).keys_[lVar9 + 2];
      bVar12 = iVar5 < iVar6;
      lVar1 = lVar9 + 1;
      iVar5 = iVar6;
    } while (bVar12);
    if ((ulong)uVar4 <= lVar9 + 2U) goto LAB_00105f55;
  }
  __assert_fail("cc(this->keys_, this->key_count())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                ,0x1c7,"BTLeafNode *storage::BTLeafNode::split(int, Record *)");
}

Assistant:

BTLeafNode *BTLeafNode::split(int key, Record *record) {
        BTLeafNode *M = new BTLeafNode;
        M->next_ = this->next_;
        this->next_ = M;
        int SN = (key_count() + 1) / 2;
        int SM = (key_count() + 1) - SN;

        int SN1 = SN, SM1 = SM;

        bool flag = false;  // first
        for (int i = key_count() - 1; i >= 0; --i) {
            int k = keys_[i];
            Record *r = record_links_[i];
            if (keys_[i] < key && !flag) {
                i++;
                k = key;
                r = record;
                flag = true;
            }
            if (SM > 0) {
                M->keys_[SM - 1] = k;
                M->record_links_[SM - 1] = r;
                SM--;
            } else {
                keys_[SN - 1] = k;
                record_links_[SN - 1] = r;
                SN--;
            }
        }
        if (SN > 0) {
            keys_[SN - 1] = key;
            record_links_[SN - 1] = record;
        }
        M->parent_ = parent_;
        this->used_links_count_ = 1 + SN1;
        M->used_links_count_ = 1 + SM1;

        assert(cc(this->keys_, this->key_count()));
        assert(cc(M->keys_, M->key_count()));

        return M;
    }